

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O0

void putOp(int cd,item *x,item *y)

{
  int iVar1;
  int local_24;
  int r;
  item *y_local;
  item *x_local;
  int cd_local;
  
  if (x->mode != 0x2c2) {
    load(x);
  }
  if (x->r == 0) {
    iVar1 = getReg();
    x->r = iVar1;
    local_24 = 0;
  }
  else {
    local_24 = x->r;
  }
  if (y->mode == 0x2bd) {
    put(cd + 0x10,local_24,x->r,y->a);
  }
  else {
    if (y->mode != 0x2c2) {
      load(y);
    }
    put(cd,x->r,local_24,y->r);
    regs[y->r] = 0;
  }
  return;
}

Assistant:

procedure
void putOp(int cd, struct item *x, struct item *y) {
	variable int r;

	/* if x is not in register, load it; then x->r holds the register the value is in */
	if (x->mode != CLASS_REG) { 
		load(x);
	}

	/* const. 0 at lh, e.g. 0 + x => use x->r to store value */
	if (x->r == 0) { 
		r = getReg();
		x->r = r; 

		/*  r[x] = r[0] + r[1] */
		r = 0; 
	} else {

		/* set r to the register the value is in */
		r = x->r; 
	}

	/* constants require immediate instructions (ADDI,CMPI,...) */
	if (y->mode == CLASS_CONST)  {
		put(cd + 16,r,x->r,y->a); 
	} else {
		if (y->mode != CLASS_REG) {
			load(y);
		}
		put(cd,x->r,r,y->r);
		regs[y->r] = 0;
	}
}